

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
                    BINDING **bindingsPtr)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  XML_Char *pXVar4;
  BINDING *pBVar5;
  BINDING *pBVar6;
  byte bVar7;
  XML_Error XVar8;
  bool bVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  size_t __n;
  
  if ((*uri == '\0') && (prefix->name != (XML_Char *)0x0)) {
    return XML_ERROR_UNDECLARING_PREFIX;
  }
  pcVar1 = prefix->name;
  bVar9 = true;
  XVar8 = XML_ERROR_RESERVED_NAMESPACE_URI;
  uVar3 = 0;
  if (pcVar1 == (char *)0x0) {
    bVar2 = 1;
    bVar7 = 0;
  }
  else {
    if (((*pcVar1 == 'x') && (pcVar1[1] == 'm')) && (pcVar1[2] == 'l')) {
      if (pcVar1[3] == '\0') {
        bVar7 = 1;
        XVar8 = XML_ERROR_RESERVED_PREFIX_XML;
        bVar2 = 0;
        goto LAB_00758fe7;
      }
      if (((pcVar1[3] == 'n') && (pcVar1[4] == 's')) && (pcVar1[5] == '\0')) {
        return XML_ERROR_RESERVED_PREFIX_XMLNS;
      }
    }
    bVar7 = 0;
    bVar2 = 1;
  }
LAB_00758fe7:
  cVar10 = *uri;
  bVar11 = 1;
  if (cVar10 != '\0') {
    bVar11 = 1;
    uVar3 = 0;
    bVar9 = true;
    do {
      if ((bVar9) && ((0x24 < uVar3 || (cVar10 != "http://www.w3.org/XML/1998/namespace"[uVar3]))))
      {
        bVar9 = false;
      }
      if (((bool)(bVar11 & bVar2)) &&
         ((0x1d < uVar3 || (cVar10 != "http://www.w3.org/2000/xmlns/"[uVar3])))) {
        bVar11 = 0;
      }
      if ((parser->m_ns != '\0') && (cVar10 == parser->m_namespaceSeparator)) {
        return XML_ERROR_SYNTAX;
      }
      cVar10 = uri[uVar3 + 1];
      uVar3 = uVar3 + 1;
    } while (cVar10 != '\0');
  }
  if (bVar7 != ((int)uVar3 == 0x24 & bVar9)) {
    return XVar8;
  }
  if (!(bool)(bVar11 & (int)uVar3 == 0x1d)) {
    __n = ((uVar3 & 0xffffffff) + 1) - (ulong)(parser->m_namespaceSeparator == '\0');
    pBVar5 = parser->m_freeBindingList;
    uVar12 = (uint)__n;
    if (pBVar5 == (BINDING *)0x0) {
      pBVar5 = (BINDING *)(*(parser->m_mem).malloc_fcn)(0x30);
      if (pBVar5 == (BINDING *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if (0x7fffffe7 < uVar12) {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar4 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((ulong)(uVar12 + 0x18));
      pBVar5->uri = pXVar4;
      if (pXVar4 == (XML_Char *)0x0) {
        (*(parser->m_mem).free_fcn)(pBVar5);
        return XML_ERROR_NO_MEMORY;
      }
      pBVar5->uriAlloc = uVar12 + 0x18;
    }
    else {
      if (pBVar5->uriAlloc < (int)uVar12) {
        if (0x7fffffe7 < uVar12) {
          return XML_ERROR_NO_MEMORY;
        }
        pXVar4 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pBVar5->uri,(ulong)(uVar12 + 0x18));
        if (pXVar4 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pBVar5->uri = pXVar4;
        pBVar5->uriAlloc = uVar12 + 0x18;
      }
      parser->m_freeBindingList = pBVar5->nextTagBinding;
    }
    pBVar5->uriLen = uVar12;
    memcpy(pBVar5->uri,uri,__n);
    if (parser->m_namespaceSeparator != '\0') {
      pBVar5->uri[__n - 1] = parser->m_namespaceSeparator;
    }
    pBVar5->prefix = prefix;
    pBVar5->attId = attId;
    pBVar5->prevPrefixBinding = prefix->binding;
    pBVar6 = pBVar5;
    if ((*uri == '\0') && (&parser->m_dtd->defaultPrefix == prefix)) {
      pBVar6 = (BINDING *)0x0;
    }
    prefix->binding = pBVar6;
    pBVar5->nextTagBinding = *bindingsPtr;
    *bindingsPtr = pBVar5;
    if ((attId != (ATTRIBUTE_ID *)0x0) &&
       (parser->m_startNamespaceDeclHandler != (XML_StartNamespaceDeclHandler)0x0)) {
      if (prefix->binding == (BINDING *)0x0) {
        uri = (XML_Char *)0x0;
      }
      (*parser->m_startNamespaceDeclHandler)(parser->m_handlerArg,prefix->name,uri);
    }
    return XML_ERROR_NONE;
  }
  return XML_ERROR_RESERVED_NAMESPACE_URI;
}

Assistant:

static enum XML_Error
addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId,
           const XML_Char *uri, BINDING **bindingsPtr) {
  static const XML_Char xmlNamespace[]
      = {ASCII_h,      ASCII_t,     ASCII_t,     ASCII_p,      ASCII_COLON,
         ASCII_SLASH,  ASCII_SLASH, ASCII_w,     ASCII_w,      ASCII_w,
         ASCII_PERIOD, ASCII_w,     ASCII_3,     ASCII_PERIOD, ASCII_o,
         ASCII_r,      ASCII_g,     ASCII_SLASH, ASCII_X,      ASCII_M,
         ASCII_L,      ASCII_SLASH, ASCII_1,     ASCII_9,      ASCII_9,
         ASCII_8,      ASCII_SLASH, ASCII_n,     ASCII_a,      ASCII_m,
         ASCII_e,      ASCII_s,     ASCII_p,     ASCII_a,      ASCII_c,
         ASCII_e,      '\0'};
  static const int xmlLen = (int)sizeof(xmlNamespace) / sizeof(XML_Char) - 1;
  static const XML_Char xmlnsNamespace[]
      = {ASCII_h,     ASCII_t,      ASCII_t, ASCII_p, ASCII_COLON,  ASCII_SLASH,
         ASCII_SLASH, ASCII_w,      ASCII_w, ASCII_w, ASCII_PERIOD, ASCII_w,
         ASCII_3,     ASCII_PERIOD, ASCII_o, ASCII_r, ASCII_g,      ASCII_SLASH,
         ASCII_2,     ASCII_0,      ASCII_0, ASCII_0, ASCII_SLASH,  ASCII_x,
         ASCII_m,     ASCII_l,      ASCII_n, ASCII_s, ASCII_SLASH,  '\0'};
  static const int xmlnsLen
      = (int)sizeof(xmlnsNamespace) / sizeof(XML_Char) - 1;

  XML_Bool mustBeXML = XML_FALSE;
  XML_Bool isXML = XML_TRUE;
  XML_Bool isXMLNS = XML_TRUE;

  BINDING *b;
  int len;

  /* empty URI is only valid for default namespace per XML NS 1.0 (not 1.1) */
  if (*uri == XML_T('\0') && prefix->name)
    return XML_ERROR_UNDECLARING_PREFIX;

  if (prefix->name && prefix->name[0] == XML_T(ASCII_x)
      && prefix->name[1] == XML_T(ASCII_m)
      && prefix->name[2] == XML_T(ASCII_l)) {
    /* Not allowed to bind xmlns */
    if (prefix->name[3] == XML_T(ASCII_n) && prefix->name[4] == XML_T(ASCII_s)
        && prefix->name[5] == XML_T('\0'))
      return XML_ERROR_RESERVED_PREFIX_XMLNS;

    if (prefix->name[3] == XML_T('\0'))
      mustBeXML = XML_TRUE;
  }

  for (len = 0; uri[len]; len++) {
    if (isXML && (len > xmlLen || uri[len] != xmlNamespace[len]))
      isXML = XML_FALSE;

    if (! mustBeXML && isXMLNS
        && (len > xmlnsLen || uri[len] != xmlnsNamespace[len]))
      isXMLNS = XML_FALSE;

    // NOTE: While Expat does not validate namespace URIs against RFC 3986,
    //       we have to at least make sure that the XML processor on top of
    //       Expat (that is splitting tag names by namespace separator into
    //       2- or 3-tuples (uri-local or uri-local-prefix)) cannot be confused
    //       by an attacker putting additional namespace separator characters
    //       into namespace declarations.  That would be ambiguous and not to
    //       be expected.
    if (parser->m_ns && (uri[len] == parser->m_namespaceSeparator)) {
      return XML_ERROR_SYNTAX;
    }
  }
  isXML = isXML && len == xmlLen;
  isXMLNS = isXMLNS && len == xmlnsLen;

  if (mustBeXML != isXML)
    return mustBeXML ? XML_ERROR_RESERVED_PREFIX_XML
                     : XML_ERROR_RESERVED_NAMESPACE_URI;

  if (isXMLNS)
    return XML_ERROR_RESERVED_NAMESPACE_URI;

  if (parser->m_namespaceSeparator)
    len++;
  if (parser->m_freeBindingList) {
    b = parser->m_freeBindingList;
    if (len > b->uriAlloc) {
      /* Detect and prevent integer overflow */
      if (len > INT_MAX - EXPAND_SPARE) {
        return XML_ERROR_NO_MEMORY;
      }

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
        return XML_ERROR_NO_MEMORY;
      }
#endif

      XML_Char *temp = (XML_Char *)REALLOC(
          parser, b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (temp == NULL)
        return XML_ERROR_NO_MEMORY;
      b->uri = temp;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    parser->m_freeBindingList = b->nextTagBinding;
  } else {
    b = (BINDING *)MALLOC(parser, sizeof(BINDING));
    if (! b)
      return XML_ERROR_NO_MEMORY;

    /* Detect and prevent integer overflow */
    if (len > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    b->uri
        = (XML_Char *)MALLOC(parser, sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (! b->uri) {
      FREE(parser, b);
      return XML_ERROR_NO_MEMORY;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (parser->m_namespaceSeparator)
    b->uri[len - 1] = parser->m_namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  /* NULL binding when default namespace undeclared */
  if (*uri == XML_T('\0') && prefix == &parser->m_dtd->defaultPrefix)
    prefix->binding = NULL;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  /* if attId == NULL then we are not starting a namespace scope */
  if (attId && parser->m_startNamespaceDeclHandler)
    parser->m_startNamespaceDeclHandler(parser->m_handlerArg, prefix->name,
                                        prefix->binding ? uri : 0);
  return XML_ERROR_NONE;
}